

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O3

string * __thiscall
glcts::(anonymous_namespace)::UniformBlockAdvanced::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 310 es                      \nin vec4 position;                    \nlayout(row_major) uniform SimpleBlock {   \n   mat4 a;                                \n   vec4 b[10];                            \n};                                        \nvoid main(void)                      \n{                                    \n    float tmp;                       \n    tmp = a[0][0] + b[0].x;          \n    gl_Position = position * tmp;    \n}"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 310 es                      \n"
			   "in vec4 position;                    \n"
			   ""
			   "layout(row_major) uniform SimpleBlock {   \n"
			   "   mat4 a;                                \n"
			   "   vec4 b[10];                            \n"
			   "};                                        \n"
			   ""
			   "void main(void)                      \n"
			   "{                                    \n"
			   "    float tmp;                       \n"
			   "    tmp = a[0][0] + b[0].x;          \n"
			   "    gl_Position = position * tmp;    \n"
			   "}";
	}